

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

bool __thiscall
capnp::_::StructReader::isCanonical
          (StructReader *this,word **readHead,word **ptrHead,bool *dataTrunc,bool *ptrTrunc)

{
  ushort uVar1;
  uint uVar2;
  word *pwVar3;
  uint uVar4;
  PointerType PVar5;
  unsigned_short ptrIndex;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  PointerReader local_58;
  
  pwVar3 = *readHead;
  if (((word *)this->data == pwVar3) && (uVar2 = this->dataSize, (uVar2 & 0x3f) == 0)) {
    uVar4 = uVar2 >> 6;
    if (uVar2 == 0) {
      bVar8 = true;
    }
    else {
      bVar8 = ((word *)this->data)[uVar4 - 1].content != 0;
    }
    *dataTrunc = bVar8;
    if (this->pointerCount == 0) {
      *ptrTrunc = true;
      *readHead = pwVar3 + uVar4;
    }
    else {
      local_58.pointer = this->pointers + (this->pointerCount - 1);
      local_58.nestingLimit = this->nestingLimit;
      local_58.segment = this->segment;
      local_58.capTable = this->capTable;
      PVar5 = PointerReader::getPointerType(&local_58);
      uVar1 = this->pointerCount;
      pwVar3 = *readHead;
      *ptrTrunc = PVar5 != NULL_;
      *readHead = (word *)((long)&pwVar3->content + (ulong)((uVar4 + uVar1) * 8));
      if (uVar1 != 0) {
        lVar7 = 0;
        uVar6 = 0;
        while( true ) {
          if (uVar6 < this->pointerCount) {
            local_58.pointer = (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar7)
            ;
            local_58.nestingLimit = this->nestingLimit;
            local_58.segment = this->segment;
            local_58.capTable = this->capTable;
          }
          else {
            local_58.segment = (SegmentReader *)0x0;
            local_58.capTable = (CapTableReader *)0x0;
            local_58.pointer = (WirePointer *)0x0;
            local_58.nestingLimit = 0x7fffffff;
          }
          bVar8 = PointerReader::isCanonical(&local_58,ptrHead);
          if (!bVar8) break;
          lVar7 = lVar7 + 8;
          bVar9 = (ulong)uVar1 - 1 == uVar6;
          uVar6 = uVar6 + 1;
          if (bVar9) {
            return bVar8;
          }
        }
        return bVar8;
      }
    }
    bVar8 = true;
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool StructReader::isCanonical(const word **readHead,
                               const word **ptrHead,
                               bool *dataTrunc,
                               bool *ptrTrunc) {
  if (this->getLocation() != *readHead) {
    // Our target area is not at the readHead, preorder fails
    return false;
  }

  if (this->getDataSectionSize() % BITS_PER_WORD != ZERO * BITS) {
    // Using legacy non-word-size structs, reject
    return false;
  }
  auto dataSize = this->getDataSectionSize() / BITS_PER_WORD;

  // Mark whether the struct is properly truncated
  KJ_IF_MAYBE(diff, trySubtract(dataSize, ONE * WORDS)) {
    *dataTrunc = this->getDataField<uint64_t>(*diff / WORDS * ELEMENTS) != 0;
  } else {
    // Data segment empty.
    *dataTrunc = true;
  }